

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

char * __thiscall cmGeneratorTarget::GetProperty(cmGeneratorTarget *this,string *prop)

{
  string *psVar1;
  bool bVar2;
  TargetType tgtType;
  cmMessenger *pcVar3;
  cmGeneratorTarget *pcVar4;
  cmListFileBacktrace local_78;
  cmGeneratorTarget *local_58;
  char *result;
  cmListFileBacktrace local_40;
  string *local_20;
  string *prop_local;
  cmGeneratorTarget *this_local;
  
  local_20 = prop;
  prop_local = (string *)this;
  tgtType = GetType(this);
  psVar1 = local_20;
  pcVar3 = cmMakefile::GetMessenger(this->Makefile);
  GetBacktrace(&local_40,this);
  bVar2 = cmTargetPropertyComputer::PassesWhitelist(tgtType,psVar1,pcVar3,&local_40);
  cmListFileBacktrace::~cmListFileBacktrace(&local_40);
  psVar1 = local_20;
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    pcVar3 = cmMakefile::GetMessenger(this->Makefile);
    GetBacktrace(&local_78,this);
    pcVar4 = (cmGeneratorTarget *)
             cmTargetPropertyComputer::GetProperty<cmGeneratorTarget>(this,psVar1,pcVar3,&local_78);
    cmListFileBacktrace::~cmListFileBacktrace(&local_78);
    this_local = pcVar4;
    if (pcVar4 == (cmGeneratorTarget *)0x0) {
      local_58 = pcVar4;
      bVar2 = cmSystemTools::GetFatalErrorOccured();
      if (bVar2) {
        this_local = (cmGeneratorTarget *)0x0;
      }
      else {
        this_local = (cmGeneratorTarget *)cmTarget::GetProperty(this->Target,local_20);
      }
    }
  }
  else {
    this_local = (cmGeneratorTarget *)0x0;
  }
  return (char *)this_local;
}

Assistant:

const char* cmGeneratorTarget::GetProperty(const std::string& prop) const
{
  if (!cmTargetPropertyComputer::PassesWhitelist(
        this->GetType(), prop, this->Makefile->GetMessenger(),
        this->GetBacktrace())) {
    return CM_NULLPTR;
  }
  if (const char* result = cmTargetPropertyComputer::GetProperty(
        this, prop, this->Makefile->GetMessenger(), this->GetBacktrace())) {
    return result;
  }
  if (cmSystemTools::GetFatalErrorOccured()) {
    return CM_NULLPTR;
  }
  return this->Target->GetProperty(prop);
}